

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O3

SSVectorBase<double> * __thiscall
soplex::SSVectorBase<double>::multAdd<double,double>
          (SSVectorBase<double> *this,double xx,SVectorBase<double> *vec)

{
  int *piVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  bool bVar6;
  int *piVar7;
  bool bVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int *piVar12;
  Real RVar13;
  double dVar14;
  
  if (this->setupStatus == true) {
    uVar10 = (ulong)vec->memused;
    if (0 < (long)uVar10) {
      pdVar5 = (this->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      bVar8 = false;
LAB_001d4d29:
      lVar9 = uVar10 * 0x10 + -8;
      uVar11 = uVar10;
      do {
        iVar3 = *(int *)((long)&vec->m_elem->val + lVar9);
        dVar2 = pdVar5[iVar3];
        dVar14 = *(double *)((long)vec->m_elem + lVar9 + -8) * xx;
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          RVar13 = Tolerances::epsilon((this->_tolerances).
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
          if (ABS(dVar2 + dVar14) <= RVar13) goto LAB_001d4ded;
          pdVar5[iVar3] = dVar2 + dVar14;
        }
        else {
          RVar13 = Tolerances::epsilon((this->_tolerances).
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
          if (RVar13 < ABS(dVar14)) {
            pdVar5[iVar3] = dVar14;
            iVar4 = (this->super_IdxSet).num;
            (this->super_IdxSet).num = iVar4 + 1;
            (this->super_IdxSet).idx[iVar4] = iVar3;
          }
        }
        lVar9 = lVar9 + -0x10;
        bVar6 = uVar11 < 2;
        uVar11 = uVar11 - 1;
        if (bVar6) {
          if (!bVar8) {
            return this;
          }
          goto LAB_001d4e65;
        }
      } while( true );
    }
  }
  else {
    lVar9 = (long)vec->memused;
    if (0 < lVar9) {
      pdVar5 = (this->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar10 = lVar9 + 1;
      piVar7 = &vec->m_elem[lVar9 + -1].idx;
      do {
        pdVar5[*piVar7] = ((Nonzero<double> *)(piVar7 + -2))->val * xx + pdVar5[*piVar7];
        uVar10 = uVar10 - 1;
        piVar7 = piVar7 + -4;
      } while (1 < uVar10);
    }
  }
  return this;
LAB_001d4ded:
  pdVar5[iVar3] = 1e-100;
  uVar10 = uVar11 - 1;
  bVar8 = true;
  if (uVar11 < 2) {
LAB_001d4e65:
    piVar7 = (this->super_IdxSet).idx;
    lVar9 = (long)(this->super_IdxSet).num;
    piVar12 = piVar7;
    if (0 < lVar9) {
      piVar1 = piVar7 + lVar9;
      do {
        dVar2 = pdVar5[*piVar7];
        RVar13 = Tolerances::epsilon((this->_tolerances).
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        if (ABS(dVar2) <= RVar13) {
          pdVar5[*piVar7] = 0.0;
        }
        else {
          *piVar12 = *piVar7;
          piVar12 = piVar12 + 1;
        }
        piVar7 = piVar7 + 1;
      } while (piVar7 < piVar1);
      piVar7 = (this->super_IdxSet).idx;
    }
    (this->super_IdxSet).num = (int)((ulong)((long)piVar12 - (long)piVar7) >> 2);
    return this;
  }
  goto LAB_001d4d29;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::multAdd(S xx, const SVectorBase<T>& vec)
{
   if(isSetup())
   {
      R* v = VectorBase<R>::val.data();
      R x;
      bool adjust = false;
      int j;

      for(int i = vec.size() - 1; i >= 0; --i)
      {
         j = vec.index(i);

         if(v[j] != 0)
         {
            x = v[j] + xx * vec.value(i);

            if(isNotZero(x, this->tolerances()->epsilon()))
               v[j] = x;
            else
            {
               adjust = true;
               v[j] = SOPLEX_VECTOR_MARKER;
            }
         }
         else
         {
            x = xx * vec.value(i);

            if(isNotZero(x, this->tolerances()->epsilon()))
            {
               v[j] = x;
               addIdx(j);
            }
         }
      }

      if(adjust)
      {
         int* iptr = idx;
         int* iiptr = idx;
         int* endptr = idx + num;

         for(; iptr < endptr; ++iptr)
         {
            x = v[*iptr];

            if(isNotZero(x, this->tolerances()->epsilon()))
               *iiptr++ = *iptr;
            else
               v[*iptr] = 0;
         }

         num = int(iiptr - idx);
      }
   }
   else
      VectorBase<R>::multAdd(xx, vec);

   assert(isConsistent());

   return *this;
}